

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O2

PIPELINE_RESOURCE_FLAGS
Diligent::SPIRVShaderResourceAttribs::GetPipelineResourceFlags(ResourceType Type)

{
  PIPELINE_RESOURCE_FLAGS PVar1;
  
  PVar1 = (PIPELINE_RESOURCE_FLAGS)(0x2000404000000 >> (Type * '\b' & 0x3f));
  if (SampledImage < Type) {
    PVar1 = PIPELINE_RESOURCE_FLAG_NONE;
  }
  return PVar1;
}

Assistant:

PIPELINE_RESOURCE_FLAGS SPIRVShaderResourceAttribs::GetPipelineResourceFlags(ResourceType Type)
{
    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please handle the new resource type below");
    switch (Type)
    {
        case SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer:
        case SPIRVShaderResourceAttribs::ResourceType::StorageTexelBuffer:
            return PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER;

        case SPIRVShaderResourceAttribs::ResourceType::SampledImage:
            return PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER;

        default:
            return PIPELINE_RESOURCE_FLAG_NONE;
    }
}